

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O2

lzma_ret lzma_properties_encode(lzma_filter *filter,uint8_t *props)

{
  lzma_ret lVar1;
  lzma_filter_encoder *plVar2;
  
  plVar2 = encoder_find(filter->id);
  if (plVar2 == (lzma_filter_encoder *)0x0) {
    lVar1 = LZMA_PROG_ERROR;
  }
  else {
    if (plVar2->props_encode != (_func_lzma_ret_void_ptr_uint8_t_ptr *)0x0) {
      lVar1 = (*plVar2->props_encode)(filter->options,props);
      return lVar1;
    }
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_encode(const lzma_filter *filter, uint8_t *props)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL)
		return LZMA_PROG_ERROR;

	if (fe->props_encode == NULL)
		return LZMA_OK;

	return fe->props_encode(filter->options, props);
}